

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  void *workSpace;
  ZSTD_strategy ZVar1;
  ZSTD_paramSwitch_e ZVar2;
  BYTE *source;
  BYTE *pBVar3;
  bool bVar4;
  int iVar5;
  uint maxNbBits;
  size_t err_code;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  symbolEncodingType_e sVar10;
  ulong uVar11;
  long lVar12;
  size_t err_code_2;
  ulong sourceSize;
  bool bVar13;
  HUF_repeat local_8c;
  ZSTD_symbolEncodingTypeStats_t local_58;
  
  source = seqStorePtr->litStart;
  pBVar3 = seqStorePtr->lit;
  ZVar1 = (cctxParams->cParams).strategy;
  ZVar2 = cctxParams->literalCompressionMode;
  bVar13 = true;
  if (ZVar2 == ZSTD_ps_auto) {
    if (ZVar1 == ZSTD_fast) {
      bVar13 = (cctxParams->cParams).targetLength == 0;
    }
  }
  else if (ZVar2 != ZSTD_ps_enable) {
    if (ZVar2 != ZSTD_ps_disable) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x264,"int ZSTD_literalsCompressionIsDisabled(const ZSTD_CCtx_params *)");
    }
    bVar13 = false;
  }
  local_58.LLtype = 0xff;
  local_8c = (prevEntropy->huf).repeatMode;
  memcpy(nextEntropy,prevEntropy,0x810);
  if (bVar13) {
    sourceSize = (long)pBVar3 - (long)source;
    uVar11 = 0x3f;
    if ((prevEntropy->huf).repeatMode == HUF_repeat_valid) {
      uVar11 = 6;
    }
    if (uVar11 < sourceSize) {
      sVar6 = HIST_count_wksp((uint *)workspace,&local_58.LLtype,source,sourceSize,workspace,
                              wkspSize);
      bVar13 = false;
      if (sVar6 < 0xffffffffffffff89) {
        sVar10 = set_rle;
        if (sVar6 != sourceSize) {
          sVar10 = set_basic;
          bVar13 = true;
          bVar4 = (sourceSize >> 7) + 4 < sVar6;
          sVar6 = 0;
          if (bVar4) goto LAB_00771eef;
        }
        (entropyMetadata->hufMetadata).hType = sVar10;
        bVar13 = false;
        sVar6 = 0;
      }
LAB_00771eef:
      sVar7 = sVar6;
      if (bVar13) {
        workSpace = (void *)((long)workspace + 0x400);
        sVar9 = wkspSize - 0x400;
        if (local_8c == HUF_repeat_check) {
          iVar5 = HUF_validateCTable((HUF_CElt *)prevEntropy,(uint *)workspace,local_58.LLtype);
          local_8c = (HUF_repeat)(iVar5 != 0);
        }
        memset(nextEntropy,0,0x808);
        maxNbBits = HUF_optimalTableLog(0xb,sourceSize,local_58.LLtype,workSpace,sVar9,
                                        (HUF_CElt *)nextEntropy,(uint *)workspace,
                                        (uint)(ZSTD_btopt < ZVar1) * 2);
        if (0xb < maxNbBits) {
          __assert_fail("huffLog <= LitHufLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0xdd5,
                        "size_t ZSTD_buildBlockEntropyStats_literals(void *const, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_hufCTablesMetadata_t *, const int, void *, size_t, int)"
                       );
        }
        sVar7 = HUF_buildCTable_wksp
                          ((HUF_CElt *)nextEntropy,(uint *)workspace,local_58.LLtype,maxNbBits,
                           workSpace,sVar9);
        if (sVar7 < 0xffffffffffffff89) {
          sVar8 = HUF_estimateCompressedSize
                            ((HUF_CElt *)nextEntropy,(uint *)workspace,local_58.LLtype);
          sVar9 = HUF_writeCTable_wksp
                            ((entropyMetadata->hufMetadata).hufDesBuffer,0x80,
                             (HUF_CElt *)nextEntropy,local_58.LLtype,(uint)sVar7,workSpace,sVar9);
          if (local_8c != HUF_repeat_none) {
            sVar7 = HUF_estimateCompressedSize
                              ((HUF_CElt *)prevEntropy,(uint *)workspace,local_58.LLtype);
            bVar13 = true;
            if ((sVar7 < sourceSize) && (sourceSize <= sVar9 + 0xc || sVar7 <= sVar8 + sVar9)) {
              memcpy(nextEntropy,prevEntropy,0x810);
              (entropyMetadata->hufMetadata).hType = set_repeat;
              bVar13 = false;
              sVar6 = 0;
            }
            sVar7 = sVar6;
            if (!bVar13) goto LAB_00771dda;
          }
          if (sVar8 + sVar9 < sourceSize) {
            (entropyMetadata->hufMetadata).hType = set_compressed;
            (nextEntropy->huf).repeatMode = HUF_repeat_check;
            sVar7 = sVar9;
          }
          else {
            memcpy(nextEntropy,prevEntropy,0x810);
            (entropyMetadata->hufMetadata).hType = set_basic;
            sVar7 = 0;
          }
        }
      }
      goto LAB_00771dda;
    }
    (entropyMetadata->hufMetadata).hType = set_basic;
  }
  else {
    (entropyMetadata->hufMetadata).hType = set_basic;
  }
  sVar7 = 0;
LAB_00771dda:
  (entropyMetadata->hufMetadata).hufDesSize = sVar7;
  if (sVar7 < 0xffffffffffffff89) {
    lVar12 = (long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart;
    if (lVar12 == 0) {
      (nextEntropy->fse).litlength_repeatMode = FSE_repeat_none;
      (nextEntropy->fse).offcode_repeatMode = FSE_repeat_none;
      (nextEntropy->fse).matchlength_repeatMode = FSE_repeat_none;
      local_58.lastCountSize = 0;
      local_58.size = 0;
      local_58.MLtype = set_basic;
      local_58.Offtype = set_basic;
      local_58.LLtype = set_basic;
    }
    else {
      ZSTD_buildSequencesStatistics
                (&local_58,seqStorePtr,lVar12 >> 3,&prevEntropy->fse,&nextEntropy->fse,
                 (entropyMetadata->fseMetadata).fseTablesBuffer,
                 &(entropyMetadata->fseMetadata).field_0x91,(cctxParams->cParams).strategy,
                 (uint *)workspace,(void *)((long)workspace + 0xd4),wkspSize - 0xd4);
    }
    if (local_58.size < 0xffffffffffffff89) {
      (entropyMetadata->fseMetadata).llType = local_58.LLtype;
      (entropyMetadata->fseMetadata).ofType = local_58.Offtype;
      (entropyMetadata->fseMetadata).mlType = local_58.MLtype;
      (entropyMetadata->fseMetadata).lastCountSize = local_58.lastCountSize;
    }
    (entropyMetadata->fseMetadata).fseTablesSize = local_58.size;
    sVar7 = 0;
    if (0xffffffffffffff88 < local_58.size) {
      sVar7 = local_58.size;
    }
  }
  return sVar7;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(
            const seqStore_t* seqStorePtr,
            const ZSTD_entropyCTables_t* prevEntropy,
                  ZSTD_entropyCTables_t* nextEntropy,
            const ZSTD_CCtx_params* cctxParams,
                  ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                  void* workspace, size_t wkspSize)
{
    size_t const litSize = (size_t)(seqStorePtr->lit - seqStorePtr->litStart);
    int const huf_useOptDepth = (cctxParams->cParams.strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD);
    int const hufFlags = huf_useOptDepth ? HUF_flags_optimalDepth : 0;

    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_literalsCompressionIsDisabled(cctxParams),
                                            workspace, wkspSize, hufFlags);

    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}